

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O1

void ymz280b_alloc_rom(void *info,UINT32 memsize)

{
  void *__s;
  ymz280b_state *chip;
  
  if (*(UINT32 *)((long)info + 0x2d8) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)info + 0x2d0),(ulong)memsize);
  *(void **)((long)info + 0x2d0) = __s;
  *(UINT32 *)((long)info + 0x2d8) = memsize;
  memset(__s,0xff,(ulong)memsize);
  return;
}

Assistant:

static void ymz280b_alloc_rom(void* info, UINT32 memsize)
{
	ymz280b_state *chip = (ymz280b_state *)info;
	
	if (chip->mem_size == memsize)
		return;
	
	chip->mem_base = (UINT8*)realloc(chip->mem_base, memsize);
	chip->mem_size = memsize;
	memset(chip->mem_base, 0xFF, memsize);
	
	return;
}